

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int pushargs(lua_State *L)

{
  int iVar1;
  int local_14;
  int n;
  int i;
  lua_State *L_local;
  
  iVar1 = lua_getglobal(L,"arg");
  if (iVar1 != 5) {
    luaL_error(L,"\'arg\' is not a table");
  }
  iVar1 = luaL_len(L,0xffffffff);
  luaL_checkstack(L,iVar1 + 3,"too many arguments to script");
  for (local_14 = 1; local_14 <= iVar1; local_14 = local_14 + 1) {
    lua_rawgeti(L,-local_14,(long)local_14);
  }
  lua_rotate(L,-local_14,0xffffffff);
  lua_settop(L,0xfffffffe);
  return iVar1;
}

Assistant:

static int pushargs (lua_State *L) {
  int i, n;
  if (lua_getglobal(L, "arg") != LUA_TTABLE)
    luaL_error(L, "'arg' is not a table");
  n = (int)luaL_len(L, -1);
  luaL_checkstack(L, n + 3, "too many arguments to script");
  for (i = 1; i <= n; i++)
    lua_rawgeti(L, -i, i);
  lua_remove(L, -i);  /* remove table from the stack */
  return n;
}